

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxp.c
# Opt level: O1

_Bool duckdb_je_fxp_parse(fxp_t *result,char *str,char **end)

{
  char *pcVar1;
  _Bool _Var2;
  long lVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  char *cur;
  char *pcVar7;
  uint uVar8;
  fxp_t fVar9;
  byte bVar10;
  
  _Var2 = true;
  if (*str == '.' || (byte)(*str - 0x30U) < 10) {
    cVar4 = *str;
    fVar9 = 0;
    if ((byte)(cVar4 - 0x30U) < 10) {
      uVar8 = 0;
      do {
        uVar8 = (uint)(byte)(cVar4 - 0x30) + uVar8 * 10;
        if (0xffff < uVar8) {
          return true;
        }
        cVar4 = str[1];
        str = str + 1;
      } while ((byte)(cVar4 - 0x30U) < 10);
      fVar9 = uVar8 * 0x10000;
    }
    if (cVar4 == '.') {
      if (9 < (byte)(str[1] - 0x30U)) {
        return true;
      }
      iVar5 = 0xe;
      lVar3 = 0;
      pcVar1 = str + 1;
      do {
        pcVar7 = pcVar1;
        bVar10 = *pcVar7 - 0x30;
        lVar6 = (long)*pcVar7 + -0x30;
        if (9 < bVar10) {
          lVar6 = 0;
        }
        lVar3 = lVar6 + lVar3 * 10;
        iVar5 = iVar5 + -1;
        pcVar1 = pcVar7 + (bVar10 < 10);
      } while (iVar5 != 0);
      str = pcVar7 + ((ulong)(bVar10 < 10) - 1);
      do {
        pcVar1 = str + 1;
        str = str + 1;
      } while ((byte)(*pcVar1 - 0x30U) < 10);
      fVar9 = fVar9 + (int)((ulong)(lVar3 * 0x10000) / 100000000000000);
    }
    *result = fVar9;
    if (end != (char **)0x0) {
      *end = str;
    }
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool
fxp_parse(fxp_t *result, const char *str, char **end) {
	/*
	 * Using malloc_strtoumax in this method isn't as handy as you might
	 * expect (I tried). In the fractional part, significant leading zeros
	 * mean that you still need to do your own parsing, now with trickier
	 * math.  In the integer part, the casting (uintmax_t to uint32_t)
	 * forces more reasoning about bounds than just checking for overflow as
	 * we parse.
	 */
	uint32_t integer_part = 0;

	const char *cur = str;

	/* The string must start with a digit or a decimal point. */
	if (*cur != '.' && !fxp_isdigit(*cur)) {
		return true;
	}

	while ('0' <= *cur && *cur <= '9') {
		integer_part *= 10;
		integer_part += *cur - '0';
		if (integer_part >= (1U << 16)) {
			return true;
		}
		cur++;
	}

	/*
	 * We've parsed all digits at the beginning of the string, without
	 * overflow.  Either we're done, or there's a fractional part.
	 */
	if (*cur != '.') {
		*result = (integer_part << 16);
		if (end != NULL) {
			*end = (char *)cur;
		}
		return false;
	}

	/* There's a fractional part. */
	cur++;
	if (!fxp_isdigit(*cur)) {
		/* Shouldn't end on the decimal point. */
		return true;
	}

	/*
	 * We use a lot of precision for the fractional part, even though we'll
	 * discard most of it; this lets us get exact values for the important
	 * special case where the denominator is a small power of 2 (for
	 * instance, 1/512 == 0.001953125 is exactly representable even with
	 * only 16 bits of fractional precision).  We need to left-shift by 16
	 * before dividing so we pick the number of digits to be
	 * floor(log(2**48)) = 14.
	 */
	uint64_t fractional_part = 0;
	uint64_t frac_div = 1;
	for (int i = 0; i < FXP_FRACTIONAL_PART_DIGITS; i++) {
		fractional_part *= 10;
		frac_div *= 10;
		if (fxp_isdigit(*cur)) {
			fractional_part += *cur - '0';
			cur++;
		}
	}
	/*
	 * We only parse the first maxdigits characters, but we can still ignore
	 * any digits after that.
	 */
	while (fxp_isdigit(*cur)) {
		cur++;
	}

	assert(fractional_part < frac_div);
	uint32_t fractional_repr = (uint32_t)(
	    (fractional_part << 16) / frac_div);

	/* Success! */
	*result = (integer_part << 16) + fractional_repr;
	if (end != NULL) {
		*end = (char *)cur;
	}
	return false;
}